

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O1

int ON_Intersect(ON_Arc *A0,ON_Arc *A1,ON_3dPoint *P0,ON_3dPoint *P1)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  ON_3dVector *this;
  ON_3dVector *v;
  int iVar8;
  int ei;
  ulong uVar9;
  ON_3dPoint *P0_00;
  ON_Arc *this_00;
  ON_Interval OVar10;
  ON_3dPoint *P [2];
  double LittleEndMatch [2];
  ON_3dPoint LittleEnd;
  double t;
  double t_1;
  ON_3dPoint CCX [2];
  double local_108;
  ON_3dPoint *local_e8 [2];
  double local_d8 [3];
  ON_3dPoint local_c0;
  ON_Arc *local_a8;
  ON_3dPoint local_a0;
  double local_88;
  ON_Interval local_80;
  double local_70;
  ON_3dPoint local_68;
  ON_3dPoint local_50;
  
  P1->z = ON_3dPoint::UnsetPoint.z;
  dVar7 = ON_3dPoint::UnsetPoint.y;
  P1->x = ON_3dPoint::UnsetPoint.x;
  P1->y = dVar7;
  dVar2 = ON_3dPoint::UnsetPoint.y;
  dVar7 = ON_3dPoint::UnsetPoint.x;
  P0->z = ON_3dPoint::UnsetPoint.z;
  P0->x = dVar7;
  P0->y = dVar2;
  local_e8[0] = P0;
  local_e8[1] = P1;
  dVar7 = ON_Circle::MaximumCoordinate(&A0->super_ON_Circle);
  dVar2 = ON_Circle::MaximumCoordinate(&A1->super_ON_Circle);
  if (dVar7 <= dVar2) {
    dVar7 = dVar2;
  }
  dVar2 = 2.3283064365386963e-10;
  if (2.3283064365386963e-10 <= dVar7 * 2.2737367544323206e-13) {
    dVar2 = dVar7 * 2.2737367544323206e-13;
  }
  P0_00 = &local_68;
  uVar5 = ON_Intersect(&A0->super_ON_Circle,&A1->super_ON_Circle,P0_00,&local_50);
  local_a8 = A1;
  if ((int)uVar5 < 3) {
    if (0 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
      iVar8 = 0;
      do {
        bVar4 = ON_Arc::ClosestPointTo(A0,P0_00,&local_a0.x);
        if (bVar4) {
          ON_Circle::PointAt(&local_c0,&A0->super_ON_Circle,local_a0.x);
          dVar7 = ON_3dPoint::DistanceTo(P0_00,&local_c0);
          if ((dVar7 < dVar2) && (bVar4 = ON_Arc::ClosestPointTo(A1,P0_00,&local_a0.x), bVar4)) {
            ON_Circle::PointAt(&local_c0,&A1->super_ON_Circle,local_a0.x);
            dVar7 = ON_3dPoint::DistanceTo(P0_00,&local_c0);
            if (dVar7 < dVar2) {
              lVar6 = (long)iVar8;
              iVar8 = iVar8 + 1;
              pOVar1 = local_e8[lVar6];
              pOVar1->z = P0_00->z;
              dVar7 = P0_00->y;
              pOVar1->x = P0_00->x;
              pOVar1->y = dVar7;
            }
          }
        }
        P0_00 = P0_00 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      return iVar8;
    }
  }
  else if (uVar5 == 3) {
    OVar10 = ON_Arc::Domain(A0);
    local_c0.y = OVar10.m_t[1];
    local_c0.x = OVar10.m_t[0];
    dVar7 = ON_Interval::Length((ON_Interval *)&local_c0);
    OVar10 = ON_Arc::Domain(A1);
    local_a0.y = OVar10.m_t[1];
    local_a0.x = OVar10.m_t[0];
    dVar3 = ON_Interval::Length((ON_Interval *)&local_a0);
    this_00 = A0;
    if (dVar3 < dVar7) {
      this_00 = A1;
      A1 = A0;
    }
    OVar10 = ON_Arc::Domain(A1);
    local_80.m_t[1] = OVar10.m_t[1];
    local_80.m_t[0] = OVar10.m_t[0];
    local_108 = -dVar2;
    dVar7 = ON_Circle::Radius(&A1->super_ON_Circle);
    bVar4 = ON_Interval::Expand(&local_80,local_108 / dVar7);
    if (!bVar4) {
      OVar10 = ON_Arc::Domain(A1);
      local_c0.y = OVar10.m_t[1];
      local_c0.x = OVar10.m_t[0];
      dVar7 = ON_Interval::Mid((ON_Interval *)&local_c0);
      OVar10 = ON_Interval::Singleton(dVar7);
      local_80.m_t[1] = OVar10.m_t[1];
      local_80.m_t[0] = OVar10.m_t[0];
    }
    lVar6 = 0;
    do {
      if (lVar6 == 0) {
        ON_Arc::StartPoint(&local_c0,this_00);
      }
      else {
        ON_Arc::EndPoint(&local_c0,this_00);
      }
      bVar4 = ON_Arc::ClosestPointTo(A1,&local_c0,&local_70);
      if (bVar4) {
        iVar8 = ON_Interval::Clamp(&local_80,&local_70);
        if (iVar8 == 1) {
          ON_Arc::EndPoint(&local_a0,A1);
          dVar7 = ON_3dPoint::DistanceTo(&local_a0,&local_c0);
          if (dVar2 <= dVar7) {
LAB_004c08c3:
            dVar7 = -1.0;
          }
          else {
            dVar7 = 1.0;
          }
          local_d8[lVar6] = dVar7;
        }
        else if (iVar8 == 0) {
          local_d8[lVar6] = 0.5;
        }
        else if (iVar8 == -1) {
          ON_Arc::StartPoint(&local_a0,A1);
          dVar7 = ON_3dPoint::DistanceTo(&local_a0,&local_c0);
          if (dVar2 <= dVar7) goto LAB_004c08c3;
          local_d8[lVar6] = 0.0;
        }
      }
      lVar6 = lVar6 + 1;
      if (lVar6 != 1) {
        if ((local_d8[0] == 0.5) && (!NAN(local_d8[0]))) {
          return 3;
        }
        if ((local_d8[1] == 0.5) && (!NAN(local_d8[1]))) {
          return 3;
        }
        if ((((local_d8[0] == -1.0) && (!NAN(local_d8[0]))) && (local_d8[1] == -1.0)) &&
           (!NAN(local_d8[1]))) {
          return 0;
        }
        if ((local_d8[0] != -1.0) || (NAN(local_d8[0]))) {
          if ((local_d8[1] != -1.0) || (NAN(local_d8[1]))) {
            local_88 = local_d8[1];
            this = ON_Circle::Normal(&A0->super_ON_Circle);
            v = ON_Circle::Normal(&local_a8->super_ON_Circle);
            dVar7 = ON_3dVector::operator*(this,v);
            if ((local_d8[0] != local_88) || (NAN(local_d8[0]) || NAN(local_88))) {
              if ((local_d8[0] != 1.0) == 0.0 < dVar7) {
                return 3;
              }
              ON_Arc::StartPoint(&local_c0,this_00);
              local_e8[0]->z = local_c0.z;
              local_e8[0]->x = local_c0.x;
              local_e8[0]->y = local_c0.y;
              ON_Arc::EndPoint(&local_c0,this_00);
              local_e8[1]->z = local_c0.z;
              local_e8[1]->x = local_c0.x;
              local_e8[1]->y = local_c0.y;
              return 2;
            }
            ON_Arc::StartPoint(&local_c0,this_00);
            ON_Arc::EndPoint(&local_a0,this_00);
            dVar7 = ON_3dPoint::DistanceTo(&local_c0,&local_a0);
            if (dVar2 <= dVar7) {
              return 3;
            }
          }
          ON_Arc::StartPoint(&local_c0,this_00);
        }
        else {
          ON_Arc::EndPoint(&local_c0,this_00);
        }
        local_e8[0]->z = local_c0.z;
        local_e8[0]->x = local_c0.x;
        local_e8[0]->y = local_c0.y;
        return 1;
      }
    } while( true );
  }
  return 0;
}

Assistant:

int ON_Intersect(
  const ON_Arc& A0,
  const ON_Arc& A1,
  ON_3dPoint& P0,
  ON_3dPoint& P1)
{
  P0 = P1 = ON_3dPoint::UnsetPoint;
  ON_3dPoint* P[] = { &P0, &P1 };
  int xcnt = 0;

  double scale0 = A0.MaximumCoordinate();
  double abstol = A1.MaximumCoordinate();
  if (abstol < scale0)
    abstol = scale0;
  abstol *= ON_RELATIVE_TOLERANCE;
  if (abstol < ON_ZERO_TOLERANCE)
    abstol = ON_ZERO_TOLERANCE;


  ON_3dPoint CCX[2];
  int cxcnt = ON_Intersect(static_cast<const ON_Circle&>(A0), static_cast<const ON_Circle&>(A1), CCX[0], CCX[1]);
  if ( cxcnt < 3)
  {
    for (int i = 0; i < cxcnt; i++)
    {
      double t;
      if (A0.ClosestPointTo(CCX[i], &t))
      {
        if (CCX[i].DistanceTo(A0.PointAt(t)) < abstol)
        {
          if (A1.ClosestPointTo(CCX[i], &t))
          {
            if (CCX[i].DistanceTo(A1.PointAt(t)) < abstol)
              *P[xcnt++] = CCX[i];
          }
        }
      }
    }
  }
  else if (cxcnt == 3)
  {
    // circle doesn't degenerate to a point
    // order arcs by size
    const  ON_Arc* Size[] = { &A0, &A1 };     //Size[0]<=Size[1]
    if (A0.Domain().Length() > A1.Domain().Length())
    {
      Size[0] = &A1;
      Size[1] = &A0;
    }

    // Match ends of smaller to larger arc
    double LittleEndMatch[2];  // relative to Big ArcBig,  0-start, 1-end , .5 (interior),  -1 ( exterior)

    ON_Interval BigInterior = Size[1]->Domain();    // interior domain of big arc
    if (!BigInterior.Expand(-abstol / Size[1]->Radius()))         // circles are not degenerate
      BigInterior = ON_Interval::Singleton(Size[1]->Domain().Mid());
    
    for (int ei = 0; ei < 2; ei++)
    {
      double t;
      ON_3dPoint LittleEnd = ei ? Size[0]->EndPoint() : Size[0]->StartPoint();
      if (Size[1]->ClosestPointTo(LittleEnd, &t))
      {
        switch (BigInterior.Clamp(t))
        {
        case(-1):
          if (Size[1]->StartPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 0;   // start
          else
            LittleEndMatch[ei] = -1;  // exterior
          break;
        case(0):
          LittleEndMatch[ei] = .5;    // interior
          break;
        case(1):
          if (Size[1]->EndPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 1;       // end
          else
            LittleEndMatch[ei] = -1;     // exterior
          break;
        }
      }
    }

    if (LittleEndMatch[0] == .5 || LittleEndMatch[1] == .5)
      xcnt = 3;     // an interior match means an overlap
    else if (LittleEndMatch[0] == -1 && LittleEndMatch[1] == -1)
      xcnt = 0;     // both points exterior means  intersection is empty
    else if (LittleEndMatch[0] == -1)
      *P[xcnt++] = Size[0]->EndPoint();    // if start is exterior end must be an intersection point
    else if (LittleEndMatch[1] == -1)
      *P[xcnt++] = Size[0]->StartPoint();
    else
    {
      // Both endpoints match endpoints of Big
      // LittleEndMatch[ei] \in { 0, 1 }
      bool Orientation_agree = (A0.Normal() * A1.Normal() > 0);     // true if  the orientations agree
      if (LittleEndMatch[0] != LittleEndMatch[1])
      {
        if (Orientation_agree == (LittleEndMatch[0] == 1.0))
        {
          *P[xcnt++] = Size[0]->StartPoint();
          *P[xcnt++] = Size[0]->EndPoint();
        }
        else
          xcnt = 3;
      }
      else
      {
        // Degenerate cases
        if (Size[0]->StartPoint().DistanceTo(Size[0]->EndPoint()) < abstol)
          *P[xcnt++] = Size[0]->StartPoint();
        else
          xcnt = 3;
      }
    }
  }
  
  return xcnt;
}